

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O0

void rx__log_style_get_ansi_code(char **code,rx__log_style style)

{
  rx__log_style style_local;
  char **code_local;
  
  if (code != (char **)0x0) {
    switch(style) {
    case RX__LOG_STYLE_RESET:
      *code = "\x1b[0m";
      break;
    case RX__LOG_STYLE_BLACK:
      *code = "\x1b[30m";
      break;
    case RX__LOG_STYLE_RED:
      *code = "\x1b[31m";
      break;
    case RX__LOG_STYLE_GREEN:
      *code = "\x1b[32m";
      break;
    case RX__LOG_STYLE_YELLOW:
      *code = "\x1b[33m";
      break;
    case RX__LOG_STYLE_BLUE:
      *code = "\x1b[34m";
      break;
    case RX__LOG_STYLE_MAGENTA:
      *code = "\x1b[35m";
      break;
    case RX__LOG_STYLE_CYAN:
      *code = "\x1b[36m";
      break;
    case RX__LOG_STYLE_BRIGHT_BLACK:
      *code = "\x1b[1;30m";
      break;
    case RX__LOG_STYLE_BRIGHT_RED:
      *code = "\x1b[1;31m";
      break;
    case RX__LOG_STYLE_BRIGHT_GREEN:
      *code = "\x1b[1;32m";
      break;
    case RX__LOG_STYLE_BRIGHT_YELLOW:
      *code = "\x1b[1;33m";
      break;
    case RX__LOG_STYLE_BRIGHT_BLUE:
      *code = "\x1b[1;34m";
      break;
    case RX__LOG_STYLE_BRIGHT_MAGENTA:
      *code = "\x1b[1;35m";
      break;
    case RX__LOG_STYLE_BRIGHT_CYAN:
      *code = "\x1b[1;36m";
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                    ,0x10f4,"void rx__log_style_get_ansi_code(const char **, enum rx__log_style)");
    }
    return;
  }
  __assert_fail("code != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                ,0x10c3,"void rx__log_style_get_ansi_code(const char **, enum rx__log_style)");
}

Assistant:

static void
rx__log_style_get_ansi_code(const char **code, enum rx__log_style style)
{
    RX_ASSERT(code != NULL);

    switch (style) {
        case RX__LOG_STYLE_RESET:
            *code = "\x1b[0m";
            return;
        case RX__LOG_STYLE_BLACK:
            *code = "\x1b[30m";
            return;
        case RX__LOG_STYLE_RED:
            *code = "\x1b[31m";
            return;
        case RX__LOG_STYLE_GREEN:
            *code = "\x1b[32m";
            return;
        case RX__LOG_STYLE_YELLOW:
            *code = "\x1b[33m";
            return;
        case RX__LOG_STYLE_BLUE:
            *code = "\x1b[34m";
            return;
        case RX__LOG_STYLE_MAGENTA:
            *code = "\x1b[35m";
            return;
        case RX__LOG_STYLE_CYAN:
            *code = "\x1b[36m";
            return;
        case RX__LOG_STYLE_BRIGHT_BLACK:
            *code = "\x1b[1;30m";
            return;
        case RX__LOG_STYLE_BRIGHT_RED:
            *code = "\x1b[1;31m";
            return;
        case RX__LOG_STYLE_BRIGHT_GREEN:
            *code = "\x1b[1;32m";
            return;
        case RX__LOG_STYLE_BRIGHT_YELLOW:
            *code = "\x1b[1;33m";
            return;
        case RX__LOG_STYLE_BRIGHT_BLUE:
            *code = "\x1b[1;34m";
            return;
        case RX__LOG_STYLE_BRIGHT_MAGENTA:
            *code = "\x1b[1;35m";
            return;
        case RX__LOG_STYLE_BRIGHT_CYAN:
            *code = "\x1b[1;36m";
            return;
        default:
            RX_ASSERT(0);
    }
}